

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

void icu_63::number::impl::blueprint_helpers::parseDigitsStem
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  int iVar1;
  char16_t cVar2;
  int32_t iVar3;
  Precision local_70;
  Precision local_50;
  int local_2c;
  int local_28;
  int maxSig;
  int minSig;
  int offset;
  UErrorCode *status_local;
  MacroProps *macros_local;
  StringSegment *segment_local;
  
  maxSig = 0;
  local_28 = 0;
  _minSig = status;
  status_local = (UErrorCode *)macros;
  macros_local = (MacroProps *)segment;
  while ((iVar1 = maxSig,
         iVar3 = numparse::impl::StringSegment::length((StringSegment *)macros_local), iVar1 < iVar3
         && (cVar2 = numparse::impl::StringSegment::charAt((StringSegment *)macros_local,maxSig),
            cVar2 == L'@'))) {
    local_28 = local_28 + 1;
    maxSig = maxSig + 1;
  }
  iVar1 = maxSig;
  iVar3 = numparse::impl::StringSegment::length((StringSegment *)macros_local);
  if (iVar1 < iVar3) {
    cVar2 = numparse::impl::StringSegment::charAt((StringSegment *)macros_local,maxSig);
    if (cVar2 == L'+') {
      local_2c = -1;
      maxSig = maxSig + 1;
    }
    else {
      local_2c = local_28;
      while ((iVar1 = maxSig,
             iVar3 = numparse::impl::StringSegment::length((StringSegment *)macros_local),
             iVar1 < iVar3 &&
             (cVar2 = numparse::impl::StringSegment::charAt((StringSegment *)macros_local,maxSig),
             cVar2 == L'#'))) {
        local_2c = local_2c + 1;
        maxSig = maxSig + 1;
      }
    }
  }
  else {
    local_2c = local_28;
  }
  iVar1 = maxSig;
  iVar3 = numparse::impl::StringSegment::length((StringSegment *)macros_local);
  if (iVar1 < iVar3) {
    *_minSig = U_NUMBER_SKELETON_SYNTAX_ERROR;
  }
  else if (local_2c == -1) {
    Precision::minSignificantDigits(&local_50,local_28);
    status_local[0x10] = local_50.fType;
    status_local[0x11] = local_50._4_4_;
    *(FractionSignificantSettings *)(status_local + 0x12) = local_50.fUnion.fracSig;
    *(undefined8 *)(status_local + 0x14) = local_50.fUnion._8_8_;
    status_local[0x16] = local_50.fRoundingMode;
  }
  else {
    Precision::minMaxSignificantDigits(&local_70,local_28,local_2c);
    status_local[0x10] = local_70.fType;
    status_local[0x11] = local_70._4_4_;
    *(FractionSignificantSettings *)(status_local + 0x12) = local_70.fUnion.fracSig;
    *(undefined8 *)(status_local + 0x14) = local_70.fUnion._8_8_;
    status_local[0x16] = local_70.fRoundingMode;
  }
  return;
}

Assistant:

void
blueprint_helpers::parseDigitsStem(const StringSegment& segment, MacroProps& macros, UErrorCode& status) {
    U_ASSERT(segment.charAt(0) == u'@');
    int offset = 0;
    int minSig = 0;
    int maxSig;
    for (; offset < segment.length(); offset++) {
        if (segment.charAt(offset) == u'@') {
            minSig++;
        } else {
            break;
        }
    }
    if (offset < segment.length()) {
        if (segment.charAt(offset) == u'+') {
            maxSig = -1;
            offset++;
        } else {
            maxSig = minSig;
            for (; offset < segment.length(); offset++) {
                if (segment.charAt(offset) == u'#') {
                    maxSig++;
                } else {
                    break;
                }
            }
        }
    } else {
        maxSig = minSig;
    }
    if (offset < segment.length()) {
        // throw new SkeletonSyntaxException("Invalid significant digits stem", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return;
    }
    // Use the public APIs to enforce bounds checking
    if (maxSig == -1) {
        macros.precision = Precision::minSignificantDigits(minSig);
    } else {
        macros.precision = Precision::minMaxSignificantDigits(minSig, maxSig);
    }
}